

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::Datum::SharedCtor(Datum *this)

{
  this->_cached_size_ = 0;
  (this->data_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->channels_ = 0;
  this->height_ = 0;
  this->width_ = 0;
  this->label_ = 0;
  this->encoded_ = false;
  return;
}

Assistant:

void Datum::SharedCtor() {
  _cached_size_ = 0;
  data_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&channels_, 0, reinterpret_cast<char*>(&encoded_) -
    reinterpret_cast<char*>(&channels_) + sizeof(encoded_));
}